

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O1

void __thiscall uint256_tests::from_user_hex::test_method(from_user_hex *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  readonly_property<bool> rVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  const_string file;
  const_string file_00;
  string_view input;
  const_string file_01;
  string_view input_00;
  const_string file_02;
  string_view input_01;
  const_string file_03;
  string_view input_02;
  const_string file_04;
  string_view input_03;
  const_string file_05;
  string_view input_04;
  const_string file_06;
  string_view input_05;
  const_string file_07;
  string_view input_06;
  const_string file_08;
  const_string file_09;
  string_view input_07;
  string_view str;
  const_string file_10;
  string_view input_08;
  string_view str_00;
  const_string file_11;
  string_view input_09;
  const_string file_12;
  string_view input_10;
  const_string file_13;
  string_view input_11;
  const_string file_14;
  string_view input_12;
  const_string file_15;
  string_view input_13;
  const_string file_16;
  string_view input_14;
  const_string file_17;
  string_view input_15;
  const_string file_18;
  string_view input_16;
  const_string file_19;
  string_view input_17;
  const_string file_20;
  string_view input_18;
  const_string file_21;
  string_view input_19;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  check_type cVar27;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  assertion_result local_1a0;
  char *local_188;
  assertion_result local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  undefined1 local_128 [32];
  undefined1 local_108 [8];
  undefined1 local_100 [24];
  undefined1 local_e8 [9];
  undefined1 uStack_df;
  undefined1 uStack_de;
  undefined1 uStack_dd;
  undefined1 uStack_dc;
  undefined1 uStack_db;
  undefined1 uStack_da;
  undefined1 uStack_d9;
  shared_count sStack_d8;
  undefined1 uStack_d0;
  undefined1 uStack_cf;
  undefined1 uStack_ce;
  undefined1 uStack_cd;
  undefined1 uStack_cc;
  undefined1 uStack_cb;
  undefined1 uStack_ca;
  undefined1 uStack_c9;
  undefined1 local_c0 [32];
  bool local_a0;
  string valid_hex_64;
  undefined1 local_78 [9];
  undefined1 auStack_6f [7];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  local_100._8_8_ = local_100._0_8_;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x12e;
  file.m_begin = (iterator)&local_1b0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c0,msg);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = "@;\x1f";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  detail::FromUserHex<uint256>
            ((optional<uint256> *)local_c0,(string_view)(ZEXT816(0xf6cf21) << 0x40));
  if (local_a0 == true) {
    auVar18[0] = -(local_c0[0] == '\0');
    auVar18[1] = -(local_c0[1] == '\0');
    auVar18[2] = -(local_c0[2] == '\0');
    auVar18[3] = -(local_c0[3] == '\0');
    auVar18[4] = -(local_c0[4] == '\0');
    auVar18[5] = -(local_c0[5] == '\0');
    auVar18[6] = -(local_c0[6] == '\0');
    auVar18[7] = -(local_c0[7] == '\0');
    auVar18[8] = -(local_c0[8] == '\0');
    auVar18[9] = -(local_c0[9] == '\0');
    auVar18[10] = -(local_c0[10] == '\0');
    auVar18[0xb] = -(local_c0[0xb] == '\0');
    auVar18[0xc] = -(local_c0[0xc] == '\0');
    auVar18[0xd] = -(local_c0[0xd] == '\0');
    auVar18[0xe] = -(local_c0[0xe] == '\0');
    auVar18[0xf] = -(local_c0[0xf] == '\0');
    auVar9[0] = -(local_c0[0x10] == '\0');
    auVar9[1] = -(local_c0[0x11] == '\0');
    auVar9[2] = -(local_c0[0x12] == '\0');
    auVar9[3] = -(local_c0[0x13] == '\0');
    auVar9[4] = -(local_c0[0x14] == '\0');
    auVar9[5] = -(local_c0[0x15] == '\0');
    auVar9[6] = -(local_c0[0x16] == '\0');
    auVar9[7] = -(local_c0[0x17] == '\0');
    auVar9[8] = -(local_c0[0x18] == '\0');
    auVar9[9] = -(local_c0[0x19] == '\0');
    auVar9[10] = -(local_c0[0x1a] == '\0');
    auVar9[0xb] = -(local_c0[0x1b] == '\0');
    auVar9[0xc] = -(local_c0[0x1c] == '\0');
    auVar9[0xd] = -(local_c0[0x1d] == '\0');
    auVar9[0xe] = -(local_c0[0x1e] == '\0');
    auVar9[0xf] = -(local_c0[0x1f] == '\0');
    auVar9 = auVar9 & auVar18;
    local_e8[0] = (class_property<bool>)
                  ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_e8[0] = (class_property<bool>)false;
  }
  local_e8[8] = false;
  uStack_df = 0;
  uStack_de = 0;
  uStack_dd = 0;
  uStack_dc = 0;
  uStack_db = 0;
  uStack_da = 0;
  uStack_d9 = 0;
  sStack_d8.pi_._0_1_ = 0;
  sStack_d8.pi_._1_1_ = 0;
  sStack_d8.pi_._2_1_ = 0;
  sStack_d8.pi_._3_1_ = 0;
  sStack_d8.pi_._4_1_ = 0;
  sStack_d8.pi_._5_1_ = 0;
  sStack_d8.pi_._6_1_ = 0;
  sStack_d8.pi_._7_1_ = 0;
  local_108 = (undefined1  [8])0xf6ac07;
  local_100._0_8_ = "";
  __str.field_2._8_8_ = local_128;
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = "@;\x1f";
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_148;
  local_148._M_dataplus._M_p = (pointer)&uint256::ZERO;
  stack0xffffffffffffff90 = (element_type *)(_auStack_6f << 8);
  local_78._0_8_ = &PTR__lazy_ostream_013ac618;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_128._0_8_ = (optional<uint256> *)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_e8,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf6b603,
             (size_t)local_108,0x12e,&__str,"uint256::ZERO",local_78);
  boost::detail::shared_count::~shared_count(&sStack_d8);
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x12f;
  file_00.m_begin = (iterator)&local_1d0;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1e0,
             msg_00);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = "@;\x1f";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input._M_str = "0x";
  input._M_len = 2;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input);
  if (local_a0 == true) {
    auVar19[0] = -(local_c0[0] == '\0');
    auVar19[1] = -(local_c0[1] == '\0');
    auVar19[2] = -(local_c0[2] == '\0');
    auVar19[3] = -(local_c0[3] == '\0');
    auVar19[4] = -(local_c0[4] == '\0');
    auVar19[5] = -(local_c0[5] == '\0');
    auVar19[6] = -(local_c0[6] == '\0');
    auVar19[7] = -(local_c0[7] == '\0');
    auVar19[8] = -(local_c0[8] == '\0');
    auVar19[9] = -(local_c0[9] == '\0');
    auVar19[10] = -(local_c0[10] == '\0');
    auVar19[0xb] = -(local_c0[0xb] == '\0');
    auVar19[0xc] = -(local_c0[0xc] == '\0');
    auVar19[0xd] = -(local_c0[0xd] == '\0');
    auVar19[0xe] = -(local_c0[0xe] == '\0');
    auVar19[0xf] = -(local_c0[0xf] == '\0');
    auVar10[0] = -(local_c0[0x10] == '\0');
    auVar10[1] = -(local_c0[0x11] == '\0');
    auVar10[2] = -(local_c0[0x12] == '\0');
    auVar10[3] = -(local_c0[0x13] == '\0');
    auVar10[4] = -(local_c0[0x14] == '\0');
    auVar10[5] = -(local_c0[0x15] == '\0');
    auVar10[6] = -(local_c0[0x16] == '\0');
    auVar10[7] = -(local_c0[0x17] == '\0');
    auVar10[8] = -(local_c0[0x18] == '\0');
    auVar10[9] = -(local_c0[0x19] == '\0');
    auVar10[10] = -(local_c0[0x1a] == '\0');
    auVar10[0xb] = -(local_c0[0x1b] == '\0');
    auVar10[0xc] = -(local_c0[0x1c] == '\0');
    auVar10[0xd] = -(local_c0[0x1d] == '\0');
    auVar10[0xe] = -(local_c0[0x1e] == '\0');
    auVar10[0xf] = -(local_c0[0x1f] == '\0');
    auVar10 = auVar10 & auVar19;
    local_e8[0] = (class_property<bool>)
                  ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_e8[0] = (class_property<bool>)false;
  }
  local_e8[8] = false;
  uStack_df = 0;
  uStack_de = 0;
  uStack_dd = 0;
  uStack_dc = 0;
  uStack_db = 0;
  uStack_da = 0;
  uStack_d9 = 0;
  sStack_d8.pi_._0_1_ = 0;
  sStack_d8.pi_._1_1_ = 0;
  sStack_d8.pi_._2_1_ = 0;
  sStack_d8.pi_._3_1_ = 0;
  sStack_d8.pi_._4_1_ = 0;
  sStack_d8.pi_._5_1_ = 0;
  sStack_d8.pi_._6_1_ = 0;
  sStack_d8.pi_._7_1_ = 0;
  local_108 = (undefined1  [8])0xf6ac07;
  local_100._0_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = "@;\x1f";
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = local_128;
  local_148._M_dataplus._M_p = (pointer)&uint256::ZERO;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_013ac618;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_148;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_128._0_8_ = (optional<uint256> *)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_e8,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf6b62a,
             (size_t)local_108,0x12f,&__str,"uint256::ZERO",local_78);
  boost::detail::shared_count::~shared_count(&sStack_d8);
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x130;
  file_01.m_begin = (iterator)&local_1f0;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_200,
             msg_01);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = "@;\x1f";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_00._M_str = "0";
  input_00._M_len = 1;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_00);
  if (local_a0 == true) {
    auVar20[0] = -(local_c0[0] == '\0');
    auVar20[1] = -(local_c0[1] == '\0');
    auVar20[2] = -(local_c0[2] == '\0');
    auVar20[3] = -(local_c0[3] == '\0');
    auVar20[4] = -(local_c0[4] == '\0');
    auVar20[5] = -(local_c0[5] == '\0');
    auVar20[6] = -(local_c0[6] == '\0');
    auVar20[7] = -(local_c0[7] == '\0');
    auVar20[8] = -(local_c0[8] == '\0');
    auVar20[9] = -(local_c0[9] == '\0');
    auVar20[10] = -(local_c0[10] == '\0');
    auVar20[0xb] = -(local_c0[0xb] == '\0');
    auVar20[0xc] = -(local_c0[0xc] == '\0');
    auVar20[0xd] = -(local_c0[0xd] == '\0');
    auVar20[0xe] = -(local_c0[0xe] == '\0');
    auVar20[0xf] = -(local_c0[0xf] == '\0');
    auVar11[0] = -(local_c0[0x10] == '\0');
    auVar11[1] = -(local_c0[0x11] == '\0');
    auVar11[2] = -(local_c0[0x12] == '\0');
    auVar11[3] = -(local_c0[0x13] == '\0');
    auVar11[4] = -(local_c0[0x14] == '\0');
    auVar11[5] = -(local_c0[0x15] == '\0');
    auVar11[6] = -(local_c0[0x16] == '\0');
    auVar11[7] = -(local_c0[0x17] == '\0');
    auVar11[8] = -(local_c0[0x18] == '\0');
    auVar11[9] = -(local_c0[0x19] == '\0');
    auVar11[10] = -(local_c0[0x1a] == '\0');
    auVar11[0xb] = -(local_c0[0x1b] == '\0');
    auVar11[0xc] = -(local_c0[0x1c] == '\0');
    auVar11[0xd] = -(local_c0[0x1d] == '\0');
    auVar11[0xe] = -(local_c0[0x1e] == '\0');
    auVar11[0xf] = -(local_c0[0x1f] == '\0');
    auVar11 = auVar11 & auVar20;
    local_e8[0] = (class_property<bool>)
                  ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_e8[0] = (class_property<bool>)false;
  }
  local_e8[8] = false;
  uStack_df = 0;
  uStack_de = 0;
  uStack_dd = 0;
  uStack_dc = 0;
  uStack_db = 0;
  uStack_da = 0;
  uStack_d9 = 0;
  sStack_d8.pi_._0_1_ = 0;
  sStack_d8.pi_._1_1_ = 0;
  sStack_d8.pi_._2_1_ = 0;
  sStack_d8.pi_._3_1_ = 0;
  sStack_d8.pi_._4_1_ = 0;
  sStack_d8.pi_._5_1_ = 0;
  sStack_d8.pi_._6_1_ = 0;
  sStack_d8.pi_._7_1_ = 0;
  local_108 = (undefined1  [8])0xf6ac07;
  local_100._0_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = "@;\x1f";
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = local_128;
  local_148._M_dataplus._M_p = (pointer)&uint256::ZERO;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_013ac618;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_148;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_128._0_8_ = (optional<uint256> *)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_e8,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf6b645,
             (size_t)local_108,0x130,&__str,"uint256::ZERO",local_78);
  boost::detail::shared_count::~shared_count(&sStack_d8);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x131;
  file_02.m_begin = (iterator)&local_210;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_220,
             msg_02);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = "@;\x1f";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_01._M_str = "00";
  input_01._M_len = 2;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_01);
  if (local_a0 == true) {
    auVar21[0] = -(local_c0[0] == '\0');
    auVar21[1] = -(local_c0[1] == '\0');
    auVar21[2] = -(local_c0[2] == '\0');
    auVar21[3] = -(local_c0[3] == '\0');
    auVar21[4] = -(local_c0[4] == '\0');
    auVar21[5] = -(local_c0[5] == '\0');
    auVar21[6] = -(local_c0[6] == '\0');
    auVar21[7] = -(local_c0[7] == '\0');
    auVar21[8] = -(local_c0[8] == '\0');
    auVar21[9] = -(local_c0[9] == '\0');
    auVar21[10] = -(local_c0[10] == '\0');
    auVar21[0xb] = -(local_c0[0xb] == '\0');
    auVar21[0xc] = -(local_c0[0xc] == '\0');
    auVar21[0xd] = -(local_c0[0xd] == '\0');
    auVar21[0xe] = -(local_c0[0xe] == '\0');
    auVar21[0xf] = -(local_c0[0xf] == '\0');
    auVar12[0] = -(local_c0[0x10] == '\0');
    auVar12[1] = -(local_c0[0x11] == '\0');
    auVar12[2] = -(local_c0[0x12] == '\0');
    auVar12[3] = -(local_c0[0x13] == '\0');
    auVar12[4] = -(local_c0[0x14] == '\0');
    auVar12[5] = -(local_c0[0x15] == '\0');
    auVar12[6] = -(local_c0[0x16] == '\0');
    auVar12[7] = -(local_c0[0x17] == '\0');
    auVar12[8] = -(local_c0[0x18] == '\0');
    auVar12[9] = -(local_c0[0x19] == '\0');
    auVar12[10] = -(local_c0[0x1a] == '\0');
    auVar12[0xb] = -(local_c0[0x1b] == '\0');
    auVar12[0xc] = -(local_c0[0x1c] == '\0');
    auVar12[0xd] = -(local_c0[0x1d] == '\0');
    auVar12[0xe] = -(local_c0[0x1e] == '\0');
    auVar12[0xf] = -(local_c0[0x1f] == '\0');
    auVar12 = auVar12 & auVar21;
    local_e8[0] = (class_property<bool>)
                  ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_e8[0] = (class_property<bool>)false;
  }
  local_e8[8] = false;
  uStack_df = 0;
  uStack_de = 0;
  uStack_dd = 0;
  uStack_dc = 0;
  uStack_db = 0;
  uStack_da = 0;
  uStack_d9 = 0;
  sStack_d8.pi_._0_1_ = 0;
  sStack_d8.pi_._1_1_ = 0;
  sStack_d8.pi_._2_1_ = 0;
  sStack_d8.pi_._3_1_ = 0;
  sStack_d8.pi_._4_1_ = 0;
  sStack_d8.pi_._5_1_ = 0;
  sStack_d8.pi_._6_1_ = 0;
  sStack_d8.pi_._7_1_ = 0;
  local_108 = (undefined1  [8])0xf6ac07;
  local_100._0_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = "@;\x1f";
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = local_128;
  local_148._M_dataplus._M_p = (pointer)&uint256::ZERO;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_013ac618;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_148;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_128._0_8_ = (optional<uint256> *)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_e8,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf6b65f,
             (size_t)local_108,0x131,&__str,"uint256::ZERO",local_78);
  boost::detail::shared_count::~shared_count(&sStack_d8);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x132;
  file_03.m_begin = (iterator)&local_230;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_240,
             msg_03);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = "@;\x1f";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_02._M_str = "1";
  input_02._M_len = 1;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_02);
  if (local_a0 == true) {
    auVar22[0] = -(local_c0[0] == '\x01');
    auVar22[1] = -(local_c0[1] == '\0');
    auVar22[2] = -(local_c0[2] == '\0');
    auVar22[3] = -(local_c0[3] == '\0');
    auVar22[4] = -(local_c0[4] == '\0');
    auVar22[5] = -(local_c0[5] == '\0');
    auVar22[6] = -(local_c0[6] == '\0');
    auVar22[7] = -(local_c0[7] == '\0');
    auVar22[8] = -(local_c0[8] == '\0');
    auVar22[9] = -(local_c0[9] == '\0');
    auVar22[10] = -(local_c0[10] == '\0');
    auVar22[0xb] = -(local_c0[0xb] == '\0');
    auVar22[0xc] = -(local_c0[0xc] == '\0');
    auVar22[0xd] = -(local_c0[0xd] == '\0');
    auVar22[0xe] = -(local_c0[0xe] == '\0');
    auVar22[0xf] = -(local_c0[0xf] == '\0');
    auVar13[0] = -(local_c0[0x10] == '\0');
    auVar13[1] = -(local_c0[0x11] == '\0');
    auVar13[2] = -(local_c0[0x12] == '\0');
    auVar13[3] = -(local_c0[0x13] == '\0');
    auVar13[4] = -(local_c0[0x14] == '\0');
    auVar13[5] = -(local_c0[0x15] == '\0');
    auVar13[6] = -(local_c0[0x16] == '\0');
    auVar13[7] = -(local_c0[0x17] == '\0');
    auVar13[8] = -(local_c0[0x18] == '\0');
    auVar13[9] = -(local_c0[0x19] == '\0');
    auVar13[10] = -(local_c0[0x1a] == '\0');
    auVar13[0xb] = -(local_c0[0x1b] == '\0');
    auVar13[0xc] = -(local_c0[0x1c] == '\0');
    auVar13[0xd] = -(local_c0[0x1d] == '\0');
    auVar13[0xe] = -(local_c0[0x1e] == '\0');
    auVar13[0xf] = -(local_c0[0x1f] == '\0');
    auVar13 = auVar13 & auVar22;
    local_e8[0] = (class_property<bool>)
                  ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_e8[0] = (class_property<bool>)false;
  }
  local_e8[8] = false;
  uStack_df = 0;
  uStack_de = 0;
  uStack_dd = 0;
  uStack_dc = 0;
  uStack_db = 0;
  uStack_da = 0;
  uStack_d9 = 0;
  sStack_d8.pi_._0_1_ = 0;
  sStack_d8.pi_._1_1_ = 0;
  sStack_d8.pi_._2_1_ = 0;
  sStack_d8.pi_._3_1_ = 0;
  sStack_d8.pi_._4_1_ = 0;
  sStack_d8.pi_._5_1_ = 0;
  sStack_d8.pi_._6_1_ = 0;
  sStack_d8.pi_._7_1_ = 0;
  local_108 = (undefined1  [8])0xf6ac07;
  local_100._0_8_ = (element_type *)0xf6ac6d;
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = "@;\x1f";
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = local_128;
  local_148._M_dataplus._M_p = (pointer)&uint256::ONE;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_013ac618;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_148;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_128._0_8_ = (optional<uint256> *)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_e8,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf6b67a,
             (size_t)local_108,0x132,&__str,"uint256::ONE",local_78);
  boost::detail::shared_count::~shared_count(&sStack_d8);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x133;
  file_04.m_begin = (iterator)&local_250;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_260,
             msg_04);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = "@;\x1f";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_03._M_str = "0x10";
  input_03._M_len = 4;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_03);
  local_e8[1] = 0;
  local_e8[2] = 0;
  local_e8[3] = 0;
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[6] = 0;
  local_e8[7] = 0;
  local_e8[8] = false;
  uStack_df = 0;
  uStack_de = 0;
  uStack_dd = 0;
  uStack_dc = 0;
  uStack_db = 0;
  uStack_da = 0;
  uStack_d9 = 0;
  sStack_d8.pi_._0_1_ = 0;
  sStack_d8.pi_._1_1_ = 0;
  sStack_d8.pi_._2_1_ = 0;
  sStack_d8.pi_._3_1_ = 0;
  sStack_d8.pi_._4_1_ = 0;
  sStack_d8.pi_._5_1_ = 0;
  sStack_d8.pi_._6_1_ = 0;
  sStack_d8.pi_._7_1_ = 0;
  uStack_d0 = 0;
  uStack_cf = 0;
  uStack_ce = 0;
  uStack_cd = 0;
  uStack_cc = 0;
  uStack_cb = 0;
  uStack_ca = 0;
  uStack_c9 = 0;
  local_e8[0] = (class_property<bool>)0x10;
  if (local_a0 == true) {
    auVar23[0] = -(local_c0[0x10] == '\0');
    auVar23[1] = -(local_c0[0x11] == '\0');
    auVar23[2] = -(local_c0[0x12] == '\0');
    auVar23[3] = -(local_c0[0x13] == '\0');
    auVar23[4] = -(local_c0[0x14] == '\0');
    auVar23[5] = -(local_c0[0x15] == '\0');
    auVar23[6] = -(local_c0[0x16] == '\0');
    auVar23[7] = -(local_c0[0x17] == '\0');
    auVar23[8] = -(local_c0[0x18] == '\0');
    auVar23[9] = -(local_c0[0x19] == '\0');
    auVar23[10] = -(local_c0[0x1a] == '\0');
    auVar23[0xb] = -(local_c0[0x1b] == '\0');
    auVar23[0xc] = -(local_c0[0x1c] == '\0');
    auVar23[0xd] = -(local_c0[0x1d] == '\0');
    auVar23[0xe] = -(local_c0[0x1e] == '\0');
    auVar23[0xf] = -(local_c0[0x1f] == '\0');
    auVar14[0] = -(local_c0[0] == '\x10');
    auVar14[1] = -(local_c0[1] == '\0');
    auVar14[2] = -(local_c0[2] == '\0');
    auVar14[3] = -(local_c0[3] == '\0');
    auVar14[4] = -(local_c0[4] == '\0');
    auVar14[5] = -(local_c0[5] == '\0');
    auVar14[6] = -(local_c0[6] == '\0');
    auVar14[7] = -(local_c0[7] == '\0');
    auVar14[8] = -(local_c0[8] == '\0');
    auVar14[9] = -(local_c0[9] == '\0');
    auVar14[10] = -(local_c0[10] == '\0');
    auVar14[0xb] = -(local_c0[0xb] == '\0');
    auVar14[0xc] = -(local_c0[0xc] == '\0');
    auVar14[0xd] = -(local_c0[0xd] == '\0');
    auVar14[0xe] = -(local_c0[0xe] == '\0');
    auVar14[0xf] = -(local_c0[0xf] == '\0');
    auVar14 = auVar14 & auVar23;
    rVar8.super_class_property<bool>.value =
         (class_property<bool>)
         ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    rVar8.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_100._0_8_ = (element_type *)0x0;
  local_100._8_8_ = (sp_counted_base *)0x0;
  local_128._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_128._8_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = "@;\x1f";
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = &local_148;
  aStack_68._8_8_ = &local_168;
  local_168._M_dataplus._M_p = local_e8;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_013ac618;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_148._M_dataplus._M_p = (pointer)local_c0;
  local_108[0] = rVar8.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf6b6a6,
             (size_t)local_128,0x133,&__str,"uint256{0x10}",local_78);
  boost::detail::shared_count::~shared_count((shared_count *)(local_100 + 8));
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x134;
  file_05.m_begin = (iterator)&local_270;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_280,
             msg_05);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = "@;\x1f";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_04._M_str = "10";
  input_04._M_len = 2;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_04);
  local_e8[1] = 0;
  local_e8[2] = 0;
  local_e8[3] = 0;
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[6] = 0;
  local_e8[7] = 0;
  local_e8[8] = false;
  uStack_df = 0;
  uStack_de = 0;
  uStack_dd = 0;
  uStack_dc = 0;
  uStack_db = 0;
  uStack_da = 0;
  uStack_d9 = 0;
  sStack_d8.pi_._0_1_ = 0;
  sStack_d8.pi_._1_1_ = 0;
  sStack_d8.pi_._2_1_ = 0;
  sStack_d8.pi_._3_1_ = 0;
  sStack_d8.pi_._4_1_ = 0;
  sStack_d8.pi_._5_1_ = 0;
  sStack_d8.pi_._6_1_ = 0;
  sStack_d8.pi_._7_1_ = 0;
  uStack_d0 = 0;
  uStack_cf = 0;
  uStack_ce = 0;
  uStack_cd = 0;
  uStack_cc = 0;
  uStack_cb = 0;
  uStack_ca = 0;
  uStack_c9 = 0;
  local_e8[0] = (class_property<bool>)0x10;
  if (local_a0 == true) {
    auVar24[0] = -(local_c0[0x10] == '\0');
    auVar24[1] = -(local_c0[0x11] == '\0');
    auVar24[2] = -(local_c0[0x12] == '\0');
    auVar24[3] = -(local_c0[0x13] == '\0');
    auVar24[4] = -(local_c0[0x14] == '\0');
    auVar24[5] = -(local_c0[0x15] == '\0');
    auVar24[6] = -(local_c0[0x16] == '\0');
    auVar24[7] = -(local_c0[0x17] == '\0');
    auVar24[8] = -(local_c0[0x18] == '\0');
    auVar24[9] = -(local_c0[0x19] == '\0');
    auVar24[10] = -(local_c0[0x1a] == '\0');
    auVar24[0xb] = -(local_c0[0x1b] == '\0');
    auVar24[0xc] = -(local_c0[0x1c] == '\0');
    auVar24[0xd] = -(local_c0[0x1d] == '\0');
    auVar24[0xe] = -(local_c0[0x1e] == '\0');
    auVar24[0xf] = -(local_c0[0x1f] == '\0');
    auVar15[0] = -(local_c0[0] == '\x10');
    auVar15[1] = -(local_c0[1] == '\0');
    auVar15[2] = -(local_c0[2] == '\0');
    auVar15[3] = -(local_c0[3] == '\0');
    auVar15[4] = -(local_c0[4] == '\0');
    auVar15[5] = -(local_c0[5] == '\0');
    auVar15[6] = -(local_c0[6] == '\0');
    auVar15[7] = -(local_c0[7] == '\0');
    auVar15[8] = -(local_c0[8] == '\0');
    auVar15[9] = -(local_c0[9] == '\0');
    auVar15[10] = -(local_c0[10] == '\0');
    auVar15[0xb] = -(local_c0[0xb] == '\0');
    auVar15[0xc] = -(local_c0[0xc] == '\0');
    auVar15[0xd] = -(local_c0[0xd] == '\0');
    auVar15[0xe] = -(local_c0[0xe] == '\0');
    auVar15[0xf] = -(local_c0[0xf] == '\0');
    auVar15 = auVar15 & auVar24;
    local_108[0] = (class_property<bool>)
                   ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_108[0] = (class_property<bool>)false;
  }
  local_100._0_8_ = (element_type *)0x0;
  local_100._8_8_ = (sp_counted_base *)0x0;
  local_128._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_128._8_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = "@;\x1f";
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = &local_148;
  local_168._M_dataplus._M_p = local_e8;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_013ac618;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_168;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_148._M_dataplus._M_p = (pointer)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf6b6d1,
             (size_t)local_128,0x134,&__str,"uint256{0x10}",local_78);
  boost::detail::shared_count::~shared_count((shared_count *)(local_100 + 8));
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x135;
  file_06.m_begin = (iterator)&local_290;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2a0,
             msg_06);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = "@;\x1f";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_05._M_str = "0xFf";
  input_05._M_len = 4;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_05);
  local_e8[1] = 0;
  local_e8[2] = 0;
  local_e8[3] = 0;
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[6] = 0;
  local_e8[7] = 0;
  local_e8[8] = false;
  uStack_df = 0;
  uStack_de = 0;
  uStack_dd = 0;
  uStack_dc = 0;
  uStack_db = 0;
  uStack_da = 0;
  uStack_d9 = 0;
  sStack_d8.pi_._0_1_ = 0;
  sStack_d8.pi_._1_1_ = 0;
  sStack_d8.pi_._2_1_ = 0;
  sStack_d8.pi_._3_1_ = 0;
  sStack_d8.pi_._4_1_ = 0;
  sStack_d8.pi_._5_1_ = 0;
  sStack_d8.pi_._6_1_ = 0;
  sStack_d8.pi_._7_1_ = 0;
  uStack_d0 = 0;
  uStack_cf = 0;
  uStack_ce = 0;
  uStack_cd = 0;
  uStack_cc = 0;
  uStack_cb = 0;
  uStack_ca = 0;
  uStack_c9 = 0;
  local_e8[0] = (class_property<bool>)0xff;
  if (local_a0 == true) {
    auVar25[0] = -(local_c0[0x10] == '\0');
    auVar25[1] = -(local_c0[0x11] == '\0');
    auVar25[2] = -(local_c0[0x12] == '\0');
    auVar25[3] = -(local_c0[0x13] == '\0');
    auVar25[4] = -(local_c0[0x14] == '\0');
    auVar25[5] = -(local_c0[0x15] == '\0');
    auVar25[6] = -(local_c0[0x16] == '\0');
    auVar25[7] = -(local_c0[0x17] == '\0');
    auVar25[8] = -(local_c0[0x18] == '\0');
    auVar25[9] = -(local_c0[0x19] == '\0');
    auVar25[10] = -(local_c0[0x1a] == '\0');
    auVar25[0xb] = -(local_c0[0x1b] == '\0');
    auVar25[0xc] = -(local_c0[0x1c] == '\0');
    auVar25[0xd] = -(local_c0[0x1d] == '\0');
    auVar25[0xe] = -(local_c0[0x1e] == '\0');
    auVar25[0xf] = -(local_c0[0x1f] == '\0');
    auVar16[0] = -(local_c0[0] == 0xff);
    auVar16[1] = -(local_c0[1] == '\0');
    auVar16[2] = -(local_c0[2] == '\0');
    auVar16[3] = -(local_c0[3] == '\0');
    auVar16[4] = -(local_c0[4] == '\0');
    auVar16[5] = -(local_c0[5] == '\0');
    auVar16[6] = -(local_c0[6] == '\0');
    auVar16[7] = -(local_c0[7] == '\0');
    auVar16[8] = -(local_c0[8] == '\0');
    auVar16[9] = -(local_c0[9] == '\0');
    auVar16[10] = -(local_c0[10] == '\0');
    auVar16[0xb] = -(local_c0[0xb] == '\0');
    auVar16[0xc] = -(local_c0[0xc] == '\0');
    auVar16[0xd] = -(local_c0[0xd] == '\0');
    auVar16[0xe] = -(local_c0[0xe] == '\0');
    auVar16[0xf] = -(local_c0[0xf] == '\0');
    auVar16 = auVar16 & auVar25;
    local_108[0] = (class_property<bool>)
                   ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_108[0] = (class_property<bool>)false;
  }
  local_100._0_8_ = (element_type *)0x0;
  local_100._8_8_ = (sp_counted_base *)0x0;
  local_128._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_128._8_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = "@;\x1f";
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = &local_148;
  local_168._M_dataplus._M_p = local_e8;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_013ac618;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_168;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_148._M_dataplus._M_p = (pointer)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf6b6f1,
             (size_t)local_128,0x135,&__str,"uint256{0xff}",local_78);
  boost::detail::shared_count::~shared_count((shared_count *)(local_100 + 8));
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x136;
  file_07.m_begin = (iterator)&local_2b0;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2c0,
             msg_07);
  valid_hex_64._M_string_length._0_1_ = 0;
  valid_hex_64._M_dataplus._M_p = "@;\x1f";
  valid_hex_64.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  valid_hex_64.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  input_06._M_str = "Ff";
  input_06._M_len = 2;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_06);
  local_e8[1] = 0;
  local_e8[2] = 0;
  local_e8[3] = 0;
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[6] = 0;
  local_e8[7] = 0;
  local_e8[8] = false;
  uStack_df = 0;
  uStack_de = 0;
  uStack_dd = 0;
  uStack_dc = 0;
  uStack_db = 0;
  uStack_da = 0;
  uStack_d9 = 0;
  sStack_d8.pi_._0_1_ = 0;
  sStack_d8.pi_._1_1_ = 0;
  sStack_d8.pi_._2_1_ = 0;
  sStack_d8.pi_._3_1_ = 0;
  sStack_d8.pi_._4_1_ = 0;
  sStack_d8.pi_._5_1_ = 0;
  sStack_d8.pi_._6_1_ = 0;
  sStack_d8.pi_._7_1_ = 0;
  uStack_d0 = 0;
  uStack_cf = 0;
  uStack_ce = 0;
  uStack_cd = 0;
  uStack_cc = 0;
  uStack_cb = 0;
  uStack_ca = 0;
  uStack_c9 = 0;
  local_e8[0] = (class_property<bool>)0xff;
  if (local_a0 == true) {
    auVar26[0] = -(local_c0[0x10] == '\0');
    auVar26[1] = -(local_c0[0x11] == '\0');
    auVar26[2] = -(local_c0[0x12] == '\0');
    auVar26[3] = -(local_c0[0x13] == '\0');
    auVar26[4] = -(local_c0[0x14] == '\0');
    auVar26[5] = -(local_c0[0x15] == '\0');
    auVar26[6] = -(local_c0[0x16] == '\0');
    auVar26[7] = -(local_c0[0x17] == '\0');
    auVar26[8] = -(local_c0[0x18] == '\0');
    auVar26[9] = -(local_c0[0x19] == '\0');
    auVar26[10] = -(local_c0[0x1a] == '\0');
    auVar26[0xb] = -(local_c0[0x1b] == '\0');
    auVar26[0xc] = -(local_c0[0x1c] == '\0');
    auVar26[0xd] = -(local_c0[0x1d] == '\0');
    auVar26[0xe] = -(local_c0[0x1e] == '\0');
    auVar26[0xf] = -(local_c0[0x1f] == '\0');
    auVar17[0] = -(local_c0[0] == 0xff);
    auVar17[1] = -(local_c0[1] == '\0');
    auVar17[2] = -(local_c0[2] == '\0');
    auVar17[3] = -(local_c0[3] == '\0');
    auVar17[4] = -(local_c0[4] == '\0');
    auVar17[5] = -(local_c0[5] == '\0');
    auVar17[6] = -(local_c0[6] == '\0');
    auVar17[7] = -(local_c0[7] == '\0');
    auVar17[8] = -(local_c0[8] == '\0');
    auVar17[9] = -(local_c0[9] == '\0');
    auVar17[10] = -(local_c0[10] == '\0');
    auVar17[0xb] = -(local_c0[0xb] == '\0');
    auVar17[0xc] = -(local_c0[0xc] == '\0');
    auVar17[0xd] = -(local_c0[0xd] == '\0');
    auVar17[0xe] = -(local_c0[0xe] == '\0');
    auVar17[0xf] = -(local_c0[0xf] == '\0');
    auVar17 = auVar17 & auVar26;
    local_108[0] = (class_property<bool>)
                   ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_108[0] = (class_property<bool>)false;
  }
  local_100._0_8_ = (element_type *)0x0;
  local_100._8_8_ = (sp_counted_base *)0x0;
  local_128._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_128._8_8_ = "";
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = "@;\x1f";
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = &local_148;
  local_168._M_dataplus._M_p = local_e8;
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_013ac618;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = &local_168;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_148._M_dataplus._M_p = (pointer)local_c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)&valid_hex_64,1,2,REQUIRE,0xf6b71c,
             (size_t)local_128,0x136,&__str,"uint256{0xff}",local_78);
  boost::detail::shared_count::~shared_count((shared_count *)(local_100 + 8));
  valid_hex_64._M_dataplus._M_p = (pointer)&valid_hex_64.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&valid_hex_64,
             "0x0123456789abcdef0123456789abcdef0123456789ABDCEF0123456789ABCDEF","");
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x138;
  file_08.m_begin = (iterator)&local_2d0;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2e0,
             msg_08);
  stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
  local_78._0_8_ = &PTR__lazy_ostream_013abb30;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_168._M_dataplus._M_p =
       (pointer)CONCAT71(valid_hex_64._M_string_length._1_7_,
                         (undefined1)valid_hex_64._M_string_length);
  local_148._M_dataplus._M_p = (pointer)&local_180;
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x42;
  local_180._1_3_ = 0;
  local_e8[0] = (class_property<bool>)(local_168._M_dataplus._M_p == (char *)0x42);
  local_e8[8] = false;
  uStack_df = 0;
  uStack_de = 0;
  uStack_dd = 0;
  uStack_dc = 0;
  uStack_db = 0;
  uStack_da = 0;
  uStack_d9 = 0;
  sStack_d8.pi_._0_1_ = 0;
  sStack_d8.pi_._1_1_ = 0;
  sStack_d8.pi_._2_1_ = 0;
  sStack_d8.pi_._3_1_ = 0;
  sStack_d8.pi_._4_1_ = 0;
  sStack_d8.pi_._5_1_ = 0;
  sStack_d8.pi_._6_1_ = 0;
  sStack_d8.pi_._7_1_ = 0;
  local_108 = (undefined1  [8])0xf6ac07;
  local_100._0_8_ = (element_type *)0xf6ac6d;
  local_128._0_8_ = &local_168;
  local_c0[8] = '\0';
  local_c0._0_8_ = &PTR__lazy_ostream_013abb70;
  local_c0._16_8_ = boost::unit_test::lazy_ostream::inst;
  __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
  __str._M_dataplus._M_p = "@;\x1f";
  __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  __str.field_2._8_8_ = &local_148;
  pvVar6 = (iterator)0x2;
  pvVar7 = (iterator)0x2;
  local_c0._24_8_ = local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_e8,(lazy_ostream *)local_78,2,2,REQUIRE,0xf6b77a,
             (size_t)local_108,0x138,(optional<uint256> *)local_c0,"2 + 64",&__str);
  boost::detail::shared_count::~shared_count(&sStack_d8);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x139;
  file_09.m_begin = (iterator)&local_2f0;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_300,
             msg_09);
  local_e8[8] = false;
  local_e8[0] = (class_property<bool>)0x30;
  local_e8[1] = 0xbb;
  local_e8[2] = 0x3a;
  local_e8[3] = 1;
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[6] = 0;
  local_e8[7] = 0;
  sStack_d8.pi_._0_1_ = 0x38;
  sStack_d8.pi_._1_1_ = 1;
  sStack_d8.pi_._2_1_ = 0x3c;
  sStack_d8.pi_._3_1_ = 1;
  sStack_d8.pi_._4_1_ = 0;
  sStack_d8.pi_._5_1_ = 0;
  sStack_d8.pi_._6_1_ = 0;
  sStack_d8.pi_._7_1_ = 0;
  uStack_d0 = 0x21;
  uStack_cf = 0xcf;
  uStack_ce = 0xf6;
  uStack_cd = 0;
  uStack_cc = 0;
  uStack_cb = 0;
  uStack_ca = 0;
  uStack_c9 = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
             &valid_hex_64,2,0xffffffffffffffff);
  input_07._M_str = (char *)local_128._0_8_;
  input_07._M_len = local_128._8_8_;
  detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_07);
  if (local_a0 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    base_blob<256u>::ToString_abi_cxx11_((string *)local_108,local_c0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_168,&valid_hex_64,2,0xffffffffffffffff);
    str._M_str = local_168._M_dataplus._M_p;
    str._M_len = local_168._M_string_length;
    ToLower_abi_cxx11_(&local_148,str);
    if (local_100._0_8_ == local_148._M_string_length) {
      if ((element_type *)local_100._0_8_ == (element_type *)0x0) {
        rVar8.super_class_property<bool>.value = (class_property<bool>)true;
      }
      else {
        iVar3 = bcmp((void *)local_108,local_148._M_dataplus._M_p,local_100._0_8_);
        rVar8.super_class_property<bool>.value = (class_property<bool>)(iVar3 == 0);
      }
    }
    else {
      rVar8.super_class_property<bool>.value = (class_property<bool>)false;
    }
    local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar8.super_class_property<bool>.value;
    local_180.m_message.px = (element_type *)0x0;
    local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1a0.m_message.pn.pi_ = (sp_counted_base *)0xf6ac07;
    local_188 = "";
    __str.field_2._8_8_ = &local_1a0.m_message;
    __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
    __str._M_dataplus._M_p = "@;\x1f";
    __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_68._8_8_ = &local_1a0;
    stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
    local_78._0_8_ = &PTR__lazy_ostream_013abbf0;
    aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_1a0._0_8_ = &local_148;
    local_1a0.m_message.px = (element_type *)local_108;
    boost::test_tools::tt_detail::report_assertion
              (&local_180,(lazy_ostream *)local_e8,1,2,REQUIRE,0xf6b795,
               (size_t)&local_1a0.m_message.pn,0x139,&__str,"ToLower(valid_hex_64.substr(2))",
               local_78);
    boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if (local_108 != (undefined1  [8])(local_100 + 8)) {
      operator_delete((void *)local_108,(ulong)(local_100._8_8_ + 1));
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_310 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_308 = "";
    local_320 = &boost::unit_test::basic_cstring<char_const>::null;
    local_318 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x13a;
    file_10.m_begin = (iterator)&local_310;
    msg_10.m_end = pvVar7;
    msg_10.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_320,
               msg_10);
    local_e8[8] = false;
    local_e8[0] = (class_property<bool>)0x30;
    local_e8[1] = 0xbb;
    local_e8[2] = 0x3a;
    local_e8[3] = 1;
    local_e8[4] = 0;
    local_e8[5] = 0;
    local_e8[6] = 0;
    local_e8[7] = 0;
    sStack_d8.pi_._0_1_ = 0x38;
    sStack_d8.pi_._1_1_ = 1;
    sStack_d8.pi_._2_1_ = 0x3c;
    sStack_d8.pi_._3_1_ = 1;
    sStack_d8.pi_._4_1_ = 0;
    sStack_d8.pi_._5_1_ = 0;
    sStack_d8.pi_._6_1_ = 0;
    sStack_d8.pi_._7_1_ = 0;
    uStack_d0 = 0x21;
    uStack_cf = 0xcf;
    uStack_ce = 0xf6;
    uStack_cd = 0;
    uStack_cc = 0;
    uStack_cb = 0;
    uStack_ca = 0;
    uStack_c9 = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
               &valid_hex_64,0,0xffffffffffffffff);
    input_08._M_str = (char *)local_128._0_8_;
    input_08._M_len = local_128._8_8_;
    detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_08);
    if (local_a0 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      base_blob<256u>::ToString_abi_cxx11_((string *)local_108,local_c0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_168,&valid_hex_64,2,0xffffffffffffffff);
      str_00._M_str = local_168._M_dataplus._M_p;
      str_00._M_len = local_168._M_string_length;
      ToLower_abi_cxx11_(&local_148,str_00);
      if (local_100._0_8_ == local_148._M_string_length) {
        if ((element_type *)local_100._0_8_ == (element_type *)0x0) {
          rVar8.super_class_property<bool>.value = (class_property<bool>)true;
        }
        else {
          iVar3 = bcmp((void *)local_108,local_148._M_dataplus._M_p,local_100._0_8_);
          rVar8.super_class_property<bool>.value = (class_property<bool>)(iVar3 == 0);
        }
      }
      else {
        rVar8.super_class_property<bool>.value = (class_property<bool>)false;
      }
      local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)rVar8.super_class_property<bool>.value;
      local_180.m_message.px = (element_type *)0x0;
      local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_1a0.m_message.pn.pi_ = (sp_counted_base *)0xf6ac07;
      local_188 = "";
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = "@;\x1f";
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      __str.field_2._8_8_ = &local_1a0.m_message;
      stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
      local_78._0_8_ = &PTR__lazy_ostream_013abbf0;
      aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_68._8_8_ = &local_1a0;
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x2;
      local_1a0._0_8_ = &local_148;
      local_1a0.m_message.px = (element_type *)local_108;
      boost::test_tools::tt_detail::report_assertion
                (&local_180,(lazy_ostream *)local_e8,1,2,REQUIRE,0xf6b7f5,
                 (size_t)&local_1a0.m_message.pn,0x13a,&__str,"ToLower(valid_hex_64.substr(2))",
                 local_78);
      boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if (local_108 != (undefined1  [8])(local_100 + 8)) {
        operator_delete((void *)local_108,(ulong)(local_100._8_8_ + 1));
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_128 + 0x10)) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      local_330 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_328 = "";
      local_340 = &boost::unit_test::basic_cstring<char_const>::null;
      local_338 = &boost::unit_test::basic_cstring<char_const>::null;
      file_11.m_end = (iterator)0x13c;
      file_11.m_begin = (iterator)&local_330;
      msg_11.m_end = pvVar7;
      msg_11.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_340,
                 msg_11);
      _cVar27 = 0x6e3252;
      input_09._M_str = "0x0 ";
      input_09._M_len = 4;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_09);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e8[0] = (class_property<bool>)0x3a;
      local_e8[1] = 0xb8;
      local_e8[2] = 0xf6;
      local_e8[3] = 0;
      local_e8[4] = 0;
      local_e8[5] = 0;
      local_e8[6] = 0;
      local_e8[7] = 0;
      local_e8[8] = true;
      uStack_df = 0xb8;
      uStack_de = 0xf6;
      uStack_dd = 0;
      uStack_dc = 0;
      uStack_db = 0;
      uStack_da = 0;
      uStack_d9 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = "@;\x1f";
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_350 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_348 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_350,0x13c);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_360 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_358 = "";
      local_370 = &boost::unit_test::basic_cstring<char_const>::null;
      local_368 = &boost::unit_test::basic_cstring<char_const>::null;
      file_12.m_end = (iterator)0x13d;
      file_12.m_begin = (iterator)&local_360;
      msg_12.m_end = pvVar7;
      msg_12.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_370,
                 msg_12);
      _cVar27 = 0x6e333b;
      input_10._M_str = " 0x0";
      input_10._M_len = 4;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_10);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e8[0] = (class_property<bool>)0x5d;
      local_e8[1] = 0xb8;
      local_e8[2] = 0xf6;
      local_e8[3] = 0;
      local_e8[4] = 0;
      local_e8[5] = 0;
      local_e8[6] = 0;
      local_e8[7] = 0;
      local_e8[8] = true;
      uStack_df = 0xb8;
      uStack_de = 0xf6;
      uStack_dd = 0;
      uStack_dc = 0;
      uStack_db = 0;
      uStack_da = 0;
      uStack_d9 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = "@;\x1f";
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_380 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_378 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_380,0x13d);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_390 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_388 = "";
      local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_398 = &boost::unit_test::basic_cstring<char_const>::null;
      file_13.m_end = (iterator)0x13e;
      file_13.m_begin = (iterator)&local_390;
      msg_13.m_end = pvVar7;
      msg_13.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3a0,
                 msg_13);
      _cVar27 = 0x6e3424;
      input_11._M_str = "0x 0";
      input_11._M_len = 4;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_11);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e8[0] = (class_property<bool>)0x80;
      local_e8[1] = 0xb8;
      local_e8[2] = 0xf6;
      local_e8[3] = 0;
      local_e8[4] = 0;
      local_e8[5] = 0;
      local_e8[6] = 0;
      local_e8[7] = 0;
      local_e8[8] = true;
      uStack_df = 0xb8;
      uStack_de = 0xf6;
      uStack_dd = 0;
      uStack_dc = 0;
      uStack_db = 0;
      uStack_da = 0;
      uStack_d9 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = "@;\x1f";
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_3b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_3a8 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_3b0,0x13e);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_3c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_3b8 = "";
      local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_14.m_end = (iterator)0x13f;
      file_14.m_begin = (iterator)&local_3c0;
      msg_14.m_end = pvVar7;
      msg_14.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3d0,
                 msg_14);
      _cVar27 = 0x6e350d;
      input_12._M_str = " ";
      input_12._M_len = 1;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_12);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e8[0] = (class_property<bool>)0x9e;
      local_e8[1] = 0xb8;
      local_e8[2] = 0xf6;
      local_e8[3] = 0;
      local_e8[4] = 0;
      local_e8[5] = 0;
      local_e8[6] = 0;
      local_e8[7] = 0;
      local_e8[8] = true;
      uStack_df = 0xb8;
      uStack_de = 0xf6;
      uStack_dd = 0;
      uStack_dc = 0;
      uStack_db = 0;
      uStack_da = 0;
      uStack_d9 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = "@;\x1f";
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_3e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_3d8 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_3e0,0x13f);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_3f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_3e8 = "";
      local_400 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_15.m_end = (iterator)0x140;
      file_15.m_begin = (iterator)&local_3f0;
      msg_15.m_end = pvVar7;
      msg_15.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_400,
                 msg_15);
      _cVar27 = 0x6e35f6;
      input_13._M_str = "0x0ga";
      input_13._M_len = 5;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_13);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e8[0] = (class_property<bool>)0xbf;
      local_e8[1] = 0xb8;
      local_e8[2] = 0xf6;
      local_e8[3] = 0;
      local_e8[4] = 0;
      local_e8[5] = 0;
      local_e8[6] = 0;
      local_e8[7] = 0;
      local_e8[8] = true;
      uStack_df = 0xb8;
      uStack_de = 0xf6;
      uStack_dd = 0;
      uStack_dc = 0;
      uStack_db = 0;
      uStack_da = 0;
      uStack_d9 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = "@;\x1f";
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_410 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_408 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_410,0x140);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_420 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_418 = "";
      local_430 = &boost::unit_test::basic_cstring<char_const>::null;
      local_428 = &boost::unit_test::basic_cstring<char_const>::null;
      file_16.m_end = (iterator)0x141;
      file_16.m_begin = (iterator)&local_420;
      msg_16.m_end = pvVar7;
      msg_16.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_430,
                 msg_16);
      _cVar27 = 0x6e36df;
      input_14._M_str = "x0";
      input_14._M_len = 2;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_14);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e8[0] = (class_property<bool>)0xde;
      local_e8[1] = 0xb8;
      local_e8[2] = 0xf6;
      local_e8[3] = 0;
      local_e8[4] = 0;
      local_e8[5] = 0;
      local_e8[6] = 0;
      local_e8[7] = 0;
      local_e8[8] = true;
      uStack_df = 0xb8;
      uStack_de = 0xf6;
      uStack_dd = 0;
      uStack_dc = 0;
      uStack_db = 0;
      uStack_da = 0;
      uStack_d9 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = "@;\x1f";
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_440 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_438 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_440,0x141);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_450 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_448 = "";
      local_460 = &boost::unit_test::basic_cstring<char_const>::null;
      local_458 = &boost::unit_test::basic_cstring<char_const>::null;
      file_17.m_end = (iterator)0x142;
      file_17.m_begin = (iterator)&local_450;
      msg_17.m_end = pvVar7;
      msg_17.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_460,
                 msg_17);
      _cVar27 = 0x6e37c8;
      input_15._M_str = "0x0x00";
      input_15._M_len = 6;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_15);
      local_78._0_8_ = CONCAT71(local_78._1_7_,local_a0) ^ 1;
      stack0xffffffffffffff90 = (element_type *)0x0;
      aStack_68._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
      local_e8[0] = (class_property<bool>)0x1;
      local_e8[1] = 0xb9;
      local_e8[2] = 0xf6;
      local_e8[3] = 0;
      local_e8[4] = 0;
      local_e8[5] = 0;
      local_e8[6] = 0;
      local_e8[7] = 0;
      local_e8[8] = true;
      uStack_df = 0xb9;
      uStack_de = 0xf6;
      uStack_dd = 0;
      uStack_dc = 0;
      uStack_db = 0;
      uStack_da = 0;
      uStack_d9 = 0;
      __str._M_string_length = __str._M_string_length & 0xffffffffffffff00;
      __str._M_dataplus._M_p = "@;\x1f";
      __str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_470 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_468 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      __str.field_2._8_8_ = (lazy_ostream *)local_e8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_78,(lazy_ostream *)&__str,1,0,WARN,_cVar27,
                 (size_t)&local_470,0x142);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
      local_480 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_478 = "";
      local_490 = &boost::unit_test::basic_cstring<char_const>::null;
      local_488 = &boost::unit_test::basic_cstring<char_const>::null;
      file_18.m_end = (iterator)0x143;
      file_18.m_begin = (iterator)&local_480;
      msg_18.m_end = pvVar7;
      msg_18.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_490,
                 msg_18);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &valid_hex_64,2,0xffffffffffffffff);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                      "0");
      paVar1 = &__str.field_2;
      __str._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p == paVar5) {
        __str.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        __str.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        __str._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        __str.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      __str._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      _cVar27 = 0x6e3949;
      input_16._M_str = __str._M_dataplus._M_p;
      input_16._M_len = __str._M_string_length;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_16);
      local_108 = (undefined1  [8])(CONCAT71(local_108._1_7_,local_a0) ^ 1);
      local_100._0_8_ = (element_type *)0x0;
      local_100._8_8_ = (sp_counted_base *)0x0;
      local_128._0_8_ = "!uint256::FromUserHex(valid_hex_64.substr(2) + \"0\")";
      local_128._8_8_ = "";
      local_e8[8] = false;
      local_e8[0] = (class_property<bool>)0x70;
      local_e8[1] = 0xbc;
      local_e8[2] = 0x3a;
      local_e8[3] = 1;
      local_e8[4] = 0;
      local_e8[5] = 0;
      local_e8[6] = 0;
      local_e8[7] = 0;
      sStack_d8.pi_._0_1_ = 0x38;
      sStack_d8.pi_._1_1_ = 1;
      sStack_d8.pi_._2_1_ = 0x3c;
      sStack_d8.pi_._3_1_ = 1;
      sStack_d8.pi_._4_1_ = 0;
      sStack_d8.pi_._5_1_ = 0;
      sStack_d8.pi_._6_1_ = 0;
      sStack_d8.pi_._7_1_ = 0;
      uStack_d0 = SUB81(local_128,0);
      uStack_cf = (undefined1)((ulong)local_128 >> 8);
      uStack_ce = (undefined1)((ulong)local_128 >> 0x10);
      uStack_cd = (undefined1)((ulong)local_128 >> 0x18);
      uStack_cc = (undefined1)((ulong)local_128 >> 0x20);
      uStack_cb = (undefined1)((ulong)local_128 >> 0x28);
      uStack_ca = (undefined1)((ulong)local_128 >> 0x30);
      uStack_c9 = (undefined1)((ulong)local_128 >> 0x38);
      local_4a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_498 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_108,(lazy_ostream *)local_e8,1,0,WARN,_cVar27,
                 (size_t)&local_4a0,0x143);
      boost::detail::shared_count::~shared_count((shared_count *)(local_100 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != &aStack_68) {
        operator_delete((void *)local_78._0_8_,(ulong)(aStack_68._M_allocated_capacity + 1));
      }
      local_4b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4a8 = "";
      local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_19.m_end = (iterator)0x144;
      file_19.m_begin = (iterator)&local_4b0;
      msg_19.m_end = pvVar7;
      msg_19.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_4c0,
                 msg_19);
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,valid_hex_64._M_dataplus._M_p,
                 valid_hex_64._M_dataplus._M_p +
                 CONCAT71(valid_hex_64._M_string_length._1_7_,
                          (undefined1)valid_hex_64._M_string_length));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&__str,"a");
      _cVar27 = 0x6e3ab8;
      input_17._M_str = __str._M_dataplus._M_p;
      input_17._M_len = __str._M_string_length;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_17);
      local_e8[0] = (class_property<bool>)(local_a0 ^ 1);
      local_e8[8] = false;
      uStack_df = 0;
      uStack_de = 0;
      uStack_dd = 0;
      uStack_dc = 0;
      uStack_db = 0;
      uStack_da = 0;
      uStack_d9 = 0;
      sStack_d8.pi_._0_1_ = 0;
      sStack_d8.pi_._1_1_ = 0;
      sStack_d8.pi_._2_1_ = 0;
      sStack_d8.pi_._3_1_ = 0;
      sStack_d8.pi_._4_1_ = 0;
      sStack_d8.pi_._5_1_ = 0;
      sStack_d8.pi_._6_1_ = 0;
      sStack_d8.pi_._7_1_ = 0;
      local_108 = (undefined1  [8])0xf6b955;
      local_100._0_8_ = (element_type *)0xf6b97e;
      stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
      local_78._0_8_ = &PTR__lazy_ostream_013abc70;
      aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_4d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4c8 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      aStack_68._8_8_ = (assertion_result *)local_108;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_78,1,0,WARN,_cVar27,
                 (size_t)&local_4d0,0x144);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      local_4e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4d8 = "";
      local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_20.m_end = (iterator)0x145;
      file_20.m_begin = (iterator)&local_4e0;
      msg_20.m_end = pvVar7;
      msg_20.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_4f0,
                 msg_20);
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,valid_hex_64._M_dataplus._M_p,
                 valid_hex_64._M_dataplus._M_p +
                 CONCAT71(valid_hex_64._M_string_length._1_7_,
                          (undefined1)valid_hex_64._M_string_length));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&__str," ");
      _cVar27 = 0x6e3bf7;
      input_18._M_str = __str._M_dataplus._M_p;
      input_18._M_len = __str._M_string_length;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_18);
      local_e8[0] = (class_property<bool>)(local_a0 ^ 1);
      local_e8[8] = false;
      uStack_df = 0;
      uStack_de = 0;
      uStack_dd = 0;
      uStack_dc = 0;
      uStack_db = 0;
      uStack_da = 0;
      uStack_d9 = 0;
      sStack_d8.pi_._0_1_ = 0;
      sStack_d8.pi_._1_1_ = 0;
      sStack_d8.pi_._2_1_ = 0;
      sStack_d8.pi_._3_1_ = 0;
      sStack_d8.pi_._4_1_ = 0;
      sStack_d8.pi_._5_1_ = 0;
      sStack_d8.pi_._6_1_ = 0;
      sStack_d8.pi_._7_1_ = 0;
      local_108 = (undefined1  [8])0xf6b97f;
      local_100._0_8_ = (element_type *)0xf6b9a8;
      stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
      local_78._0_8_ = &PTR__lazy_ostream_013abc70;
      aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_500 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_4f8 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      aStack_68._8_8_ = (assertion_result *)local_108;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_78,1,0,WARN,_cVar27,
                 (size_t)&local_500,0x145);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      local_510 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_508 = "";
      local_520 = &boost::unit_test::basic_cstring<char_const>::null;
      local_518 = &boost::unit_test::basic_cstring<char_const>::null;
      file_21.m_end = (iterator)0x146;
      file_21.m_begin = (iterator)&local_510;
      msg_21.m_end = pvVar7;
      msg_21.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_520,
                 msg_21);
      __str._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,valid_hex_64._M_dataplus._M_p,
                 valid_hex_64._M_dataplus._M_p +
                 CONCAT71(valid_hex_64._M_string_length._1_7_,
                          (undefined1)valid_hex_64._M_string_length));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&__str,"z");
      _cVar27 = 0x6e3d36;
      input_19._M_str = __str._M_dataplus._M_p;
      input_19._M_len = __str._M_string_length;
      detail::FromUserHex<uint256>((optional<uint256> *)local_c0,input_19);
      local_e8[0] = (class_property<bool>)(local_a0 ^ 1);
      local_e8[8] = false;
      uStack_df = 0;
      uStack_de = 0;
      uStack_dd = 0;
      uStack_dc = 0;
      uStack_db = 0;
      uStack_da = 0;
      uStack_d9 = 0;
      sStack_d8.pi_._0_1_ = 0;
      sStack_d8.pi_._1_1_ = 0;
      sStack_d8.pi_._2_1_ = 0;
      sStack_d8.pi_._3_1_ = 0;
      sStack_d8.pi_._4_1_ = 0;
      sStack_d8.pi_._5_1_ = 0;
      sStack_d8.pi_._6_1_ = 0;
      sStack_d8.pi_._7_1_ = 0;
      local_108 = (undefined1  [8])0xf6b9a9;
      local_100._0_8_ = (element_type *)0xf6b9d2;
      stack0xffffffffffffff90 = (element_type *)(local_78._9_8_ << 8);
      local_78._0_8_ = &PTR__lazy_ostream_013abc70;
      aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_530 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_528 = "";
      aStack_68._8_8_ = (assertion_result *)local_108;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_78,1,0,WARN,_cVar27,
                 (size_t)&local_530,0x146);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)valid_hex_64._M_dataplus._M_p != &valid_hex_64.field_2) {
        operator_delete(valid_hex_64._M_dataplus._M_p,valid_hex_64.field_2._M_allocated_capacity + 1
                       );
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(from_user_hex)
{
    BOOST_CHECK_EQUAL(uint256::FromUserHex(""), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0x"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("00"), uint256::ZERO);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("1"), uint256::ONE);
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0x10"), uint256{0x10});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("10"), uint256{0x10});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("0xFf"), uint256{0xff});
    BOOST_CHECK_EQUAL(uint256::FromUserHex("Ff"), uint256{0xff});
    const std::string valid_hex_64{"0x0123456789abcdef0123456789abcdef0123456789ABDCEF0123456789ABCDEF"};
    BOOST_REQUIRE_EQUAL(valid_hex_64.size(), 2 + 64); // 0x prefix and 64 hex digits
    BOOST_CHECK_EQUAL(uint256::FromUserHex(valid_hex_64.substr(2)).value().ToString(), ToLower(valid_hex_64.substr(2)));
    BOOST_CHECK_EQUAL(uint256::FromUserHex(valid_hex_64.substr(0)).value().ToString(), ToLower(valid_hex_64.substr(2)));

    BOOST_CHECK(!uint256::FromUserHex("0x0 "));                       // no spaces at end,
    BOOST_CHECK(!uint256::FromUserHex(" 0x0"));                       // or beginning,
    BOOST_CHECK(!uint256::FromUserHex("0x 0"));                       // or middle,
    BOOST_CHECK(!uint256::FromUserHex(" "));                          // etc.
    BOOST_CHECK(!uint256::FromUserHex("0x0ga"));                      // invalid character
    BOOST_CHECK(!uint256::FromUserHex("x0"));                         // broken prefix
    BOOST_CHECK(!uint256::FromUserHex("0x0x00"));                     // two prefixes not allowed
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64.substr(2) + "0")); // 1 hex digit too many
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + "a"));           // 1 hex digit too many
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + " "));           // whitespace after max length
    BOOST_CHECK(!uint256::FromUserHex(valid_hex_64 + "z"));           // invalid character after max length
}